

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCode.cpp
# Opt level: O1

void Hpipe::InstructionCode::write_code
               (StreamSepMaker *ss,CppEmitter *cpp_emitter,string *str,string *repl)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_type sVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  char *__end;
  size_type pos;
  ostringstream val;
  long *local_238;
  long local_230;
  long local_228 [2];
  StreamSepMaker *local_218;
  string local_210;
  string local_1f0 [3];
  ios_base local_180 [264];
  StreamSep local_78;
  
  p_Var1 = &(cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header;
  local_218 = ss;
  for (p_Var4 = (cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    sVar3 = 0;
    while (sVar3 = find_var_in_code(str,(string *)(p_Var4 + 1),sVar3), sVar3 != 0xffffffffffffffff)
    {
      std::__cxx11::string::replace((ulong)str,sVar3,(char *)0x0,0x17e6aa);
      std::__cxx11::string::_M_assign((string *)str);
      sVar3 = (long)&(p_Var4[1]._M_parent)->_M_parent + sVar3 + 3;
    }
  }
  sVar3 = 0;
  while( true ) {
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"RETURN_STOP_CONT","");
    sVar3 = find_var_in_code(str,local_1f0,sVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,local_1f0[0].field_2._M_allocated_capacity + 1);
    }
    if (sVar3 == 0xffffffffffffffff) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"HPIPE_DATA.inp_cont = &&c_",0x1a);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; return RET_STOP_CONT; c_",0x1a);
    cpp_emitter->nb_cont_label = cpp_emitter->nb_cont_label + 1;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":;",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)str,sVar3,(char *)0x10,(ulong)local_238);
    std::__cxx11::string::_M_assign((string *)str);
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    sVar3 = sVar3 + local_230;
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
  }
  if (repl->_M_string_length != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar2,pcVar2 + str->_M_string_length);
    CppEmitter::repl_data(local_1f0,cpp_emitter,&local_210,repl);
    std::__cxx11::string::operator=((string *)str,(string *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,local_1f0[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var4 = (cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      sVar3 = 0;
      while( true ) {
        local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"__data","");
        sVar3 = find_var_in_code(str,local_1f0,sVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
          operator_delete(local_1f0[0]._M_dataplus._M_p,
                          local_1f0[0].field_2._M_allocated_capacity + 1);
        }
        if (sVar3 == 0xffffffffffffffff) break;
        std::__cxx11::string::replace((ulong)str,sVar3,(char *)0x2,0x17c0d4);
        std::__cxx11::string::_M_assign((string *)str);
        sVar3 = sVar3 + 4;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  StreamSepMaker::operator<<(&local_78,local_218,str);
  StreamSep::~StreamSep(&local_78);
  return;
}

Assistant:

void InstructionCode::write_code( StreamSepMaker &ss, CppEmitter *cpp_emitter, std::string str, const std::string &repl ) {
    // variables
    for( auto &p : cpp_emitter->variables ) {
        for( std::string::size_type pos = 0; ; ) {
            pos = find_var_in_code( str, p.first, pos );
            if ( pos == std::string::npos )
                break;
            str = str.replace( pos, 0, "HPIPE_DATA." );
            pos += 11 + p.first.size();
        }
    }

    // RETURN_CONT
    for( std::string::size_type pos = 0; ; ) {
        pos = find_var_in_code( str, "RETURN_STOP_CONT", pos );
        if ( pos == std::string::npos )
            break;
        // ++cpp_emitter->nb_cont_label;
        std::ostringstream val;
        val << "HPIPE_DATA.inp_cont = &&c_" << cpp_emitter->nb_cont_label << "; return RET_STOP_CONT; c_" << ++cpp_emitter->nb_cont_label << ":;";
        str = str.replace( pos, 16, val.str() );
        pos += val.str().size();
    }

    // data -> *( save + x ), ...
    if ( repl.size() )
        str = cpp_emitter->repl_data( str, repl );

    // __data -> data
    for( auto &p : cpp_emitter->variables ) {
        for( std::string::size_type pos = 0; ; ) {
            pos = find_var_in_code( str, "__data", pos );
            if ( pos == std::string::npos )
                break;
            str = str.replace( pos, 2, "", 0 );
            pos += 4;
        }
    }

    ss << str;
}